

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCLine hashline;
  byte *pbVar1;
  CTState *cts;
  long lVar2;
  undefined1 uVar3;
  char cVar4;
  uint uVar5;
  CTypeID CVar6;
  int iVar7;
  CPToken CVar8;
  CPscl CVar9;
  CTypeID id;
  ulong uVar10;
  ErrMsg em;
  int iVar11;
  CType *ct;
  CPDecl decl;
  CType *local_9e8;
  int local_9dc;
  CType *local_9d8;
  CPDecl local_9d0;
  
  *(undefined4 *)((long)L->cframe + 0xc) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x68) = 1;
  *(undefined1 *)((long)ud + 0x7f) = 0;
  *(undefined1 *)((long)ud + 0x78) = 0xff;
  pbVar1 = *(byte **)((long)ud + 0x20);
  *(undefined8 *)((long)ud + 0x40) = *(undefined8 *)((long)ud + 0x48);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x38) = 0;
  *(byte **)((long)ud + 0x20) = pbVar1 + 1;
  uVar5 = (uint)*pbVar1;
  *(uint *)ud = uVar5;
  if (uVar5 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x70) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 0x74) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&local_9d0,0);
    cp_declarator((CPState *)ud,&local_9d0);
    CVar6 = cp_decl_intern((CPState *)ud,&local_9d0);
    *(CTypeID *)((long)ud + 0xc) = CVar6;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
  }
  else {
    iVar7 = *(int *)((long)ud + 4);
    if (iVar7 != 0x103) {
      iVar11 = 1;
      do {
        if (iVar7 == 0x23) {
          hashline = *(BCLine *)((long)ud + 0x68);
          CVar8 = cp_next((CPState *)ud);
          if (CVar8 == 0x100) {
            lVar2 = *(long *)((long)ud + 0x10);
            if (*(int *)(lVar2 + 0x14) == 6) {
              if (*(short *)(lVar2 + 0x1c) != 0x616d || *(int *)(lVar2 + 0x18) != 0x67617270)
              goto LAB_00145b40;
              cp_next((CPState *)ud);
              if (*(int *)((long)ud + 4) != 0x100) {
                if (*(int *)((long)ud + 4) == 0x103) goto LAB_001459e5;
LAB_00145a41:
                do {
                  if (*(int *)((long)ud + 0x68) != hashline) break;
                  cp_next((CPState *)ud);
                } while (*(int *)((long)ud + 4) != 0x103);
                goto LAB_001459e5;
              }
              if ((*(int *)(*(long *)((long)ud + 0x10) + 0x14) != 4) ||
                 (*(int *)(*(long *)((long)ud + 0x10) + 0x18) != 0x6b636170)) goto LAB_00145a41;
              cp_next((CPState *)ud);
              cp_check((CPState *)ud,0x28);
              iVar7 = *(int *)((long)ud + 4);
              if (iVar7 != 0x100) {
LAB_00145af6:
                if (iVar7 == 0x102) {
                  uVar5 = *(uint *)((long)ud + 8);
                  iVar7 = 0x1f;
                  if (uVar5 != 0) {
                    for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                    }
                  }
                  uVar3 = (undefined1)iVar7;
                  if (uVar5 == 0) {
                    uVar3 = 0;
                  }
                  *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = uVar3;
                  cp_next((CPState *)ud);
                }
                else {
                  *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = 0xff;
                }
LAB_00145b21:
                cp_check((CPState *)ud,0x29);
                goto LAB_001459e5;
              }
              lVar2 = *(long *)((long)ud + 0x10);
              if (*(int *)(lVar2 + 0x14) == 3) {
                if (*(char *)(lVar2 + 0x1a) == 'p' && *(short *)(lVar2 + 0x18) == 0x6f70) {
                  if (*(char *)((long)ud + 0x7f) != '\0') {
                    cVar4 = *(char *)((long)ud + 0x7f) + -1;
                    goto LAB_00145ada;
                  }
                  goto LAB_00145add;
                }
              }
              else if ((*(int *)(lVar2 + 0x14) == 4) && (*(int *)(lVar2 + 0x18) == 0x68737570)) {
                uVar10 = (ulong)*(byte *)((long)ud + 0x7f);
                if (5 < uVar10) {
                  CVar8 = 0x100;
                  em = LJ_ERR_XLEVELS;
                  goto LAB_00145b4b;
                }
                *(undefined1 *)((long)ud + uVar10 + 0x79) =
                     *(undefined1 *)((long)ud + uVar10 + 0x78);
                cVar4 = *(char *)((long)ud + 0x7f) + '\x01';
LAB_00145ada:
                *(char *)((long)ud + 0x7f) = cVar4;
LAB_00145add:
                cp_next((CPState *)ud);
                if (*(int *)((long)ud + 4) == 0x2c) {
                  cp_next((CPState *)ud);
                  iVar7 = *(int *)((long)ud + 4);
                  goto LAB_00145af6;
                }
                goto LAB_00145b21;
              }
              CVar8 = 0x100;
            }
            else {
              if ((*(int *)(lVar2 + 0x14) == 4) && (*(int *)(lVar2 + 0x18) == 0x656e696c)) {
                CVar8 = cp_next((CPState *)ud);
                if (CVar8 != 0x102) {
                  cp_err_token((CPState *)ud,0x100);
                }
                goto LAB_001459db;
              }
LAB_00145b40:
              CVar8 = *(CPToken *)((long)ud + 4);
            }
            em = LJ_ERR_XSYMBOL;
LAB_00145b4b:
            cp_errmsg((CPState *)ud,CVar8,em);
          }
          if (CVar8 != 0x102) goto LAB_00145b40;
LAB_001459db:
          cp_line((CPState *)ud,hashline);
        }
        else {
          if (iVar7 == 0x3b) {
            cp_next((CPState *)ud);
          }
          else {
            local_9dc = iVar11;
            CVar9 = cp_decl_spec((CPState *)ud,&local_9d0,0x38000);
            iVar7 = *(int *)((long)ud + 4);
            if ((((iVar7 != 0x103) && (iVar7 != 0x3b)) ||
                ((local_9d0.stack[0].info & 0xf0000000) != 0x70000000)) ||
               (((*(uint *)(**(long **)((long)ud + 0x50) +
                           (ulong)(local_9d0.stack[0].info & 0xffff) * 0x18) >> 0x1c) - 1 &
                0xfffffffb) != 0)) {
              do {
                cp_declarator((CPState *)ud,&local_9d0);
                CVar6 = cp_decl_intern((CPState *)ud,&local_9d0);
                if ((local_9d0.name != (GCstr *)0x0) && (local_9d0.nameid == 0)) {
                  cts = *(CTState **)((long)ud + 0x50);
                  if ((short)CVar9 < 0) {
                    id = lj_ctype_new(cts,&local_9e8);
                    local_9e8->info = CVar6 + 0x70000000;
                  }
                  else {
                    if ((cts->tab[CVar6].info & 0xf0000000) == 0x60000000) {
                      local_9e8 = cts->tab + CVar6;
                      id = CVar6;
                    }
                    else {
                      if ((CVar9 >> 0x11 & 1) != 0) {
                        id = cp_decl_constinit((CPState *)ud,&local_9e8,CVar6);
                        goto LAB_00145954;
                      }
                      id = lj_ctype_new(cts,&local_9e8);
                      local_9e8->info = CVar6 + 0xc0000000;
                    }
                    if (local_9d0.redir != (GCstr *)0x0) {
                      CVar6 = lj_ctype_new(*(CTState **)((long)ud + 0x50),&local_9d8);
                      local_9e8 = (CType *)(**(long **)((long)ud + 0x50) + (ulong)id * 0x18);
                      local_9d8->info = 0x80040000;
                      local_9d8->sib = local_9e8->sib;
                      local_9e8->sib = (CTypeID1)CVar6;
                      (local_9d0.redir)->marked = (local_9d0.redir)->marked | 0x20;
                      (local_9d8->name).gcptr64 = (uint64_t)local_9d0.redir;
                    }
                  }
LAB_00145954:
                  (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
                  (local_9e8->name).gcptr64 = (uint64_t)local_9d0.name;
                  lj_ctype_addname(*(CTState **)((long)ud + 0x50),local_9e8,id);
                }
                iVar7 = *(int *)((long)ud + 4);
                if (iVar7 != 0x2c) break;
                cp_next((CPState *)ud);
                local_9d0.pos = local_9d0.specpos;
                local_9d0.top = local_9d0.specpos + 1;
                local_9d0.stack[local_9d0.specpos].next = 0;
                local_9d0.attr = local_9d0.specattr;
                local_9d0.fattr = local_9d0.specfattr;
                local_9d0.name = (GCstr *)0x0;
                local_9d0.redir = (GCstr *)0x0;
              } while( true );
            }
            if (local_9dc != 0 && iVar7 == 0x103) break;
            cp_check((CPState *)ud,0x3b);
          }
          iVar11 = 0;
        }
LAB_001459e5:
        iVar7 = *(int *)((long)ud + 4);
      } while (iVar7 != 0x103);
    }
  }
  if ((*(long *)((long)ud + 0x58) != 0) &&
     (*(long *)((long)ud + 0x58) != *(long *)(*(long *)((long)ud + 0x48) + 0x28))) {
    cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}